

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InThread.cpp
# Opt level: O1

void __thiscall Thread::run(Thread *this)

{
  Element *pEVar1;
  longlong __tmp;
  long lVar2;
  longlong __tmp_4;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  AutoTableElement tableElement;
  Report report;
  TextElement textElement;
  TextElement titleElement;
  ImageElement imageElement;
  HelloWorldTableModel tableModel;
  QArrayDataPointer<char16_t> local_148;
  QArrayDataPointer<char16_t> local_128;
  QArrayDataPointer<char16_t> local_108;
  QString local_f0;
  QArrayDataPointer<char16_t> local_d8;
  QByteArrayView local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  undefined4 local_50;
  undefined2 uStack_4c;
  undefined2 uStack_4a;
  undefined6 uStack_48;
  undefined **local_40 [2];
  
  KDReports::Report::Report((Report *)&local_f0,(QObject *)0x0);
  local_c0.m_size = 0x1071e2;
  QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_a8,(char **)&local_c0)
  ;
  QVar3.m_data._4_4_ = local_a8.d._4_4_;
  QVar3.m_data._0_4_ = local_a8.d._0_4_;
  QVar3.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar3);
  local_128.d._0_4_ = 0;
  local_128.d._4_2_ = 0;
  local_128.d._6_2_ = 0;
  local_128.ptr._0_6_ = 0;
  local_128.ptr._6_2_ = 0;
  local_68.size = local_128.size;
  local_128.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  QImage::QImage((QImage *)&local_148,(QString *)&local_68,(char *)0x0);
  KDReports::Report::setWatermarkImage((QImage *)&local_f0);
  QImage::~QImage((QImage *)&local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  local_128.size = 0;
  local_128.d._0_4_ = 0;
  local_128.d._4_2_ = 0;
  local_128.d._6_2_ = 0;
  local_128.ptr._0_6_ = 0;
  local_128.ptr._6_2_ = 0;
  local_a8.d._0_4_ = 1;
  local_a8.d._4_4_ = 0xccccffff;
  local_a8.ptr._0_4_ = 0xcccccccc;
  local_a8.ptr._4_2_ = 0;
  local_148.d._0_4_ = 0;
  local_148.d._4_2_ = 0;
  local_148.d._6_2_ = 0;
  local_148.ptr._0_6_ = 0x107492;
  local_148.ptr._6_2_ = 0;
  local_148.size = 9;
  local_68.size = 0;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  QFont::QFont((QFont *)&local_c0,(QString *)&local_148,0x30,-1,false);
  KDReports::Report::setWatermarkText(&local_f0,(int)&local_128,(QColor *)0x0,(QFont *)&local_a8);
  QFont::~QFont((QFont *)&local_c0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  local_d8.d = (Data *)0x1071f3;
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_c0,(char **)&local_d8);
  QVar4.m_data = (storage_type *)local_c0.m_size;
  QVar4.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar4);
  local_a8.d._0_4_ = local_128.d._0_4_;
  local_a8.d._4_4_ =
       (undefined4)
       (CONCAT26(local_128.d._6_2_,CONCAT24(local_128.d._4_2_,local_128.d._0_4_)) >> 0x20);
  local_a8.ptr._0_4_ = (undefined4)local_128.ptr._0_6_;
  local_a8.ptr._4_2_ = (undefined2)((uint6)local_128.ptr._0_6_ >> 0x20);
  local_a8.ptr._6_2_ = local_128.ptr._6_2_;
  local_128.d._0_4_ = 0;
  local_128.d._4_2_ = 0;
  local_128.d._6_2_ = 0;
  local_128.ptr._6_2_ = 0;
  local_a8.size = local_128.size;
  local_128.size = 0;
  local_128.ptr._0_6_ = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  QImage::QImage((QImage *)&local_148,(QString *)&local_a8,(char *)0x0);
  KDReports::ImageElement::ImageElement((ImageElement *)&local_68,(QImage *)&local_148);
  QImage::~QImage((QImage *)&local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  pEVar1 = (Element *)KDReports::Report::header(&local_f0,6);
  KDReports::Header::addElement(pEVar1,(AlignmentFlag)&local_68);
  QMetaObject::tr((char *)&local_128,(char *)&QObject::staticMetaObject,0x1071fe);
  KDReports::TextElement::TextElement((TextElement *)&local_a8,(QString *)&local_128);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  KDReports::TextElement::setPointSize(18.0);
  local_128.d._0_4_ = 0;
  local_128.d._4_2_ = 0xffff;
  local_128.d._6_2_ = 0;
  local_128.ptr._0_6_ = 0;
  KDReports::Report::addElement((Element *)&local_f0,(AlignmentFlag)&local_a8,(QColor *)0x4);
  KDReports::Report::addVerticalSpacing(10.0);
  local_128.d._0_4_ = 0;
  local_128.d._4_2_ = 0;
  local_128.d._6_2_ = 0;
  local_128.ptr._0_6_ = 0;
  local_128.ptr._6_2_ = 0;
  local_128.size = 0;
  KDReports::TextElement::TextElement((TextElement *)&local_c0,(QString *)&local_128);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  QMetaObject::tr((char *)&local_128,(char *)&QObject::staticMetaObject,0x10721d);
  KDReports::TextElement::operator<<((TextElement *)&local_c0,(QString *)&local_128);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  local_108.d = (Data *)0x10724f;
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&local_d8,(char **)&local_108);
  QVar5.m_data = (storage_type *)local_d8.d;
  QVar5.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar5);
  local_148.d._0_4_ = local_128.d._0_4_;
  local_148.d._4_2_ = local_128.d._4_2_;
  local_148.d._6_2_ = local_128.d._6_2_;
  local_148.ptr._0_6_ = local_128.ptr._0_6_;
  local_148.ptr._6_2_ = local_128.ptr._6_2_;
  local_128.d._0_4_ = 0;
  local_128.d._4_2_ = 0;
  local_128.d._6_2_ = 0;
  local_128.ptr._0_6_ = 0;
  local_128.ptr._6_2_ = 0;
  local_148.size = local_128.size;
  local_128.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  KDReports::TextElement::operator<<((TextElement *)&local_c0,(QString *)&local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
  QMetaObject::tr((char *)&local_128,(char *)&QObject::staticMetaObject,0x107251);
  KDReports::TextElement::operator<<((TextElement *)&local_c0,(QString *)&local_128);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  local_108.d = (Data *)0x10724f;
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&local_d8,(char **)&local_108);
  QVar6.m_data = (storage_type *)local_d8.d;
  QVar6.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar6);
  local_148.d._0_4_ = local_128.d._0_4_;
  local_148.d._4_2_ = local_128.d._4_2_;
  local_148.d._6_2_ = local_128.d._6_2_;
  local_148.ptr._0_6_ = local_128.ptr._0_6_;
  local_148.ptr._6_2_ = local_128.ptr._6_2_;
  local_128.d._0_4_ = 0;
  local_128.d._4_2_ = 0;
  local_128.d._6_2_ = 0;
  local_128.ptr._0_6_ = 0;
  local_128.ptr._6_2_ = 0;
  local_148.size = local_128.size;
  local_128.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
  KDReports::TextElement::operator<<((TextElement *)&local_c0,(QString *)&local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
  local_128.d._0_4_ = 0;
  local_128.d._4_2_ = 0xffff;
  local_128.d._6_2_ = 0;
  local_128.ptr._0_6_ = 0;
  KDReports::Report::addElement((Element *)&local_f0,(AlignmentFlag)&local_c0,(QColor *)0x1);
  QAbstractTableModel::QAbstractTableModel((QAbstractTableModel *)local_40,(QObject *)0x0);
  local_40[0] = &PTR_metaObject_0011ca30;
  KDReports::Report::addVerticalSpacing(10.0);
  KDReports::AutoTableElement::AutoTableElement
            ((AutoTableElement *)&local_128,(QAbstractItemModel *)local_40);
  KDReports::AbstractTableElement::setBorder(1.0);
  local_148.d._0_4_ = 0;
  local_148.d._4_2_ = 0xffff;
  local_148.d._6_2_ = 0;
  local_148.ptr._0_6_ = 0;
  KDReports::Report::addElement((Element *)&local_f0,(AlignmentFlag)&local_128,(QColor *)0x1);
  lVar2 = 1;
  do {
    local_108.d = (Data *)0x0;
    local_108.ptr = L"<b>Customer</b> <em>%1</em>";
    local_108.size = 0x1b;
    local_88.size = 0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    QString::arg((longlong)&local_d8,(int)&local_108,(int)lVar2,(QChar)0x0);
    KDReports::HtmlElement::HtmlElement((HtmlElement *)&local_148,(QString *)&local_d8);
    local_50 = 0;
    uStack_4c = 0xffff;
    uStack_4a = 0;
    uStack_48 = 0;
    KDReports::Report::addElement((Element *)&local_f0,(AlignmentFlag)&local_148,(QColor *)0x1);
    KDReports::HtmlElement::~HtmlElement((HtmlElement *)&local_148);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    local_50 = 0x107298;
    uStack_4c = 0;
    uStack_4a = 0;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)&local_88,(char **)&local_50);
    QVar7.m_data = (storage_type *)local_88.d;
    QVar7.m_size = (qsizetype)&local_148;
    QString::fromUtf8(QVar7);
    local_108.d = (Data *)CONCAT26(local_148.d._6_2_,CONCAT24(local_148.d._4_2_,local_148.d._0_4_));
    local_108.ptr = (char16_t *)CONCAT26(local_148.ptr._6_2_,local_148.ptr._0_6_);
    local_148.d._0_4_ = 0;
    local_148.d._4_2_ = 0;
    local_148.d._6_2_ = 0;
    local_148.ptr._0_6_ = 0;
    local_148.ptr._6_2_ = 0;
    local_108.size = local_148.size;
    local_148.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    KDReports::TextElement::TextElement((TextElement *)&local_d8,(QString *)&local_108);
    KDReports::Report::addInlineElement((Element *)&local_f0);
    KDReports::TextElement::~TextElement((TextElement *)&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 100);
  KDReports::Report::addPageBreak();
  local_50 = 0x1072a1;
  uStack_4c = 0;
  uStack_4a = 0;
  QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_88,(char **)&local_50)
  ;
  QVar8.m_data = (storage_type *)local_88.d;
  QVar8.m_size = (qsizetype)&local_148;
  QString::fromUtf8(QVar8);
  local_108.d = (Data *)CONCAT26(local_148.d._6_2_,CONCAT24(local_148.d._4_2_,local_148.d._0_4_));
  local_108.ptr = (char16_t *)CONCAT26(local_148.ptr._6_2_,local_148.ptr._0_6_);
  local_148.d._0_4_ = 0;
  local_148.d._4_2_ = 0;
  local_148.d._6_2_ = 0;
  local_148.ptr._0_6_ = 0;
  local_148.ptr._6_2_ = 0;
  local_108.size = local_148.size;
  local_148.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
  KDReports::TextElement::TextElement((TextElement *)&local_d8,(QString *)&local_108);
  local_148.d._0_4_ = 0;
  local_148.d._4_2_ = 0xffff;
  local_148.d._6_2_ = 0;
  local_148.ptr._0_6_ = 0;
  KDReports::Report::addElement((Element *)&local_f0,(AlignmentFlag)&local_d8,(QColor *)0x1);
  KDReports::TextElement::~TextElement((TextElement *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
  local_88.d = (Data *)0x1070ba;
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&local_108,(char **)&local_88);
  QVar9.m_data = (storage_type *)local_108.d;
  QVar9.m_size = (qsizetype)&local_148;
  QString::fromUtf8(QVar9);
  local_d8.d = (Data *)CONCAT26(local_148.d._6_2_,CONCAT24(local_148.d._4_2_,local_148.d._0_4_));
  local_d8.ptr = (char16_t *)CONCAT26(local_148.ptr._6_2_,local_148.ptr._0_6_);
  local_148.d._0_4_ = 0;
  local_148.d._4_2_ = 0;
  local_148.d._6_2_ = 0;
  local_148.ptr._0_6_ = 0;
  local_148.ptr._6_2_ = 0;
  local_d8.size = local_148.size;
  local_148.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
  KDReports::Report::exportToImage((QSize)&local_f0,(QString *)0x4b0000000c8,(char *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  local_88.d = (Data *)0x107030;
  QByteArrayView::QByteArrayView<const_char_*,_true>
            ((QByteArrayView *)&local_108,(char **)&local_88);
  QVar10.m_data = (storage_type *)local_108.d;
  QVar10.m_size = (qsizetype)&local_148;
  QString::fromUtf8(QVar10);
  local_d8.d = (Data *)CONCAT26(local_148.d._6_2_,CONCAT24(local_148.d._4_2_,local_148.d._0_4_));
  local_d8.ptr = (char16_t *)CONCAT26(local_148.ptr._6_2_,local_148.ptr._0_6_);
  local_148.d._0_4_ = 0;
  local_148.d._4_2_ = 0;
  local_148.d._6_2_ = 0;
  local_148.ptr._0_6_ = 0;
  local_148.ptr._6_2_ = 0;
  local_d8.size = local_148.size;
  local_148.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
  KDReports::Report::exportToFile(&local_f0,(QWidget *)&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)&local_128);
  QAbstractTableModel::~QAbstractTableModel((QAbstractTableModel *)local_40);
  KDReports::TextElement::~TextElement((TextElement *)&local_c0);
  KDReports::TextElement::~TextElement((TextElement *)&local_a8);
  KDReports::ImageElement::~ImageElement((ImageElement *)&local_68);
  KDReports::Report::~Report((Report *)&local_f0);
  return;
}

Assistant:

void run() override
    {

        // Create a report
        KDReports::Report report;

        report.setWatermarkImage(QImage(":/background.jpg"));
        report.setWatermarkText(QString());

        KDReports::ImageElement imageElement(QImage(":/logo.png"));
        report.header().addElement(imageElement);

        // Add a text element for the title
        KDReports::TextElement titleElement(QObject::tr("KD Reports Hello world example"));
        titleElement.setPointSize(18);
        report.addElement(titleElement, Qt::AlignHCenter);

        // A bit of spacing (10 mm)
        report.addVerticalSpacing(10);

        // Add another text element, demonstrating "<<" operator
        KDReports::TextElement textElement;
        textElement << QObject::tr("This is a sample report produced with KD Reports.");
        textElement << "\n";
        textElement << QObject::tr("Klarälvdalens Datakonsult AB, Platform-independent software solutions");
        textElement << "\n";
        report.addElement(textElement);

        // Create a table model, which will be used by the table element
        HelloWorldTableModel tableModel;

        // A bit of spacing (10 mm)
        report.addVerticalSpacing(10);

        // Add an "auto table" (a table that shows the contents of a model)
        KDReports::AutoTableElement tableElement(&tableModel);
        tableElement.setBorder(1);
        report.addElement(tableElement);

        // Add many paragraphs, to demonstrate page breaking
        for (int i = 1; i < 100; ++i) {
            report.addElement(KDReports::HtmlElement(QStringLiteral("<b>Customer</b> <em>%1</em>").arg(i)), Qt::AlignLeft);
            report.addInlineElement(KDReports::TextElement("  - 2006"));
        }

        // Add a page break
        report.addPageBreak();

        report.addElement(KDReports::TextElement("This is the last page"));

        // To export to an image file:
        // qDebug() << "Exporting to output.png";
        report.exportToImage(QSize(200, 1200), "output.png", "PNG"); // deleted by main() below

        // To export to a PDF file:
        // qDebug() << "Exporting to output.pdf";
        report.exportToFile("output.pdf"); // deleted by main() below
    }